

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

int run_test_fs_poll_getpath(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_1;
  int64_t eval_a_1;
  size_t len;
  char buf [1024];
  
  loop = uv_default_loop();
  remove("testfile");
  iVar1 = uv_fs_poll_init(loop,&poll_handle);
  buf._0_8_ = SEXT48(iVar1);
  len = 0;
  if (buf._0_8_ == 0) {
    len = 0x400;
    eval_a_1 = -0x16;
    iVar1 = uv_fs_poll_getpath(&poll_handle,buf,&len);
    eval_b_1 = (int64_t)iVar1;
    if (eval_b_1 == -0x16) {
      iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
      eval_a_1 = (int64_t)iVar1;
      eval_b_1 = 0;
      if (eval_a_1 == 0) {
        len = 0x400;
        iVar1 = uv_fs_poll_getpath(&poll_handle,buf,&len);
        eval_a_1 = (int64_t)iVar1;
        eval_b_1 = 0;
        if (eval_a_1 == 0) {
          eval_a_1 = 0;
          if (buf[len - 1] == '\0') {
            pcVar4 = "!=";
            pcVar5 = "buf[len - 1]";
            pcVar3 = "0";
            uVar2 = 0xb9;
            eval_b_1 = 0;
          }
          else {
            eval_a_1 = (int64_t)buf[len];
            eval_b_1 = 0;
            if (eval_a_1 == 0) {
              iVar1 = memcmp(buf,"testfile",len);
              eval_a_1 = (int64_t)iVar1;
              eval_b_1 = 0;
              if (eval_a_1 == 0) {
                uv_close((uv_handle_t *)&poll_handle,close_cb);
                iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                eval_a_1 = (int64_t)iVar1;
                eval_b_1 = 0;
                if (eval_a_1 == 0) {
                  eval_a_1 = 1;
                  eval_b_1 = (int64_t)close_cb_called;
                  if (eval_b_1 == 1) {
                    close_loop(loop);
                    eval_a_1 = 0;
                    iVar1 = uv_loop_close(loop);
                    eval_b_1 = (int64_t)iVar1;
                    if (eval_b_1 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar4 = "==";
                    pcVar5 = "uv_loop_close(loop)";
                    pcVar3 = "0";
                    uVar2 = 0xc3;
                  }
                  else {
                    pcVar4 = "==";
                    pcVar5 = "close_cb_called";
                    pcVar3 = "1";
                    uVar2 = 0xc1;
                  }
                }
                else {
                  pcVar4 = "==";
                  pcVar5 = "0";
                  pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                  uVar2 = 0xbf;
                }
              }
              else {
                pcVar4 = "==";
                pcVar5 = "0";
                pcVar3 = "memcmp(buf, \"testfile\", len)";
                uVar2 = 0xbb;
              }
            }
            else {
              pcVar4 = "==";
              pcVar5 = "\'\\0\'";
              pcVar3 = "buf[len]";
              uVar2 = 0xba;
            }
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "0";
          pcVar3 = "uv_fs_poll_getpath(&poll_handle, buf, &len)";
          uVar2 = 0xb8;
        }
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "uv_fs_poll_start(&poll_handle, poll_cb_fail, \"testfile\", 100)";
        uVar2 = 0xb6;
      }
    }
    else {
      pcVar4 = "==";
      pcVar5 = "uv_fs_poll_getpath(&poll_handle, buf, &len)";
      pcVar3 = "UV_EINVAL";
      uVar2 = 0xb5;
    }
  }
  else {
    pcVar5 = "0";
    pcVar3 = "uv_fs_poll_init(loop, &poll_handle)";
    uVar2 = 0xb3;
    eval_b_1 = 0;
    pcVar4 = "==";
    eval_a_1 = buf._0_8_;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a_1,pcVar4,eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_getpath) {
  char buf[1024];
  size_t len;
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT_OK(uv_fs_poll_init(loop, &poll_handle));
  len = sizeof buf;
  ASSERT_EQ(UV_EINVAL, uv_fs_poll_getpath(&poll_handle, buf, &len));
  ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  len = sizeof buf;
  ASSERT_OK(uv_fs_poll_getpath(&poll_handle, buf, &len));
  ASSERT_NE(0, buf[len - 1]);
  ASSERT_EQ(buf[len], '\0');
  ASSERT_OK(memcmp(buf, FIXTURE, len));

  uv_close((uv_handle_t*) &poll_handle, close_cb);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}